

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf8Dfa.h
# Opt level: O1

void __thiscall
axl::enc::Utf8Dfa::
emitPendingCus<axl::enc::Convert<axl::enc::Utf32,axl::enc::Utf8,axl::enc::ToCaseFolded,axl::enc::Utf8Decoder>::EncodingEmitter_s>
          (Utf8Dfa *this,EncodingEmitter_s *emitter,utf8_t *p)

{
  uint_t uVar1;
  utf32_t uVar2;
  uint uVar3;
  utf32_t *puVar4;
  
  uVar1 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_state;
  switch(uVar1 << 0x1d | uVar1 - 0x10 >> 3) {
  case 0:
  case 1:
    uVar3 = 0xc0;
    break;
  case 2:
  case 3:
    uVar3 = 0xe0;
    break;
  case 4:
    uVar3 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 | 0xe0;
    goto LAB_00123a2b;
  default:
    goto switchD_001239e2_caseD_5;
  case 6:
  case 7:
    uVar3 = 0xf0;
    break;
  case 8:
    uVar3 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 | 0xf0;
LAB_00123a2b:
    puVar4 = (emitter->super_EncodingEmitter_u).m_p;
    uVar2 = toCaseFolded(uVar3);
    *puVar4 = uVar2;
    (emitter->super_EncodingEmitter_u).m_p = puVar4 + 1;
    uVar2 = toCaseFolded((this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp & 0x3fU |
                         0x80);
    puVar4[1] = uVar2;
    puVar4 = puVar4 + 2;
    goto LAB_00123aaf;
  case 10:
    puVar4 = (emitter->super_EncodingEmitter_u).m_p;
    uVar2 = toCaseFolded((this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 0xc |
                         0xf0);
    *puVar4 = uVar2;
    (emitter->super_EncodingEmitter_u).m_p = puVar4 + 1;
    uVar2 = toCaseFolded((uint)(this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >>
                         6 & 0x3f | 0x80);
    puVar4[1] = uVar2;
    (emitter->super_EncodingEmitter_u).m_p = puVar4 + 2;
    uVar2 = toCaseFolded((this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp & 0x3fU |
                         0x80);
    puVar4[2] = uVar2;
    puVar4 = puVar4 + 3;
    goto LAB_00123aaf;
  }
  puVar4 = (emitter->super_EncodingEmitter_u).m_p;
  uVar2 = toCaseFolded(uVar3 | (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp);
  *puVar4 = uVar2;
  puVar4 = puVar4 + 1;
LAB_00123aaf:
  (emitter->super_EncodingEmitter_u).m_p = puVar4;
switchD_001239e2_caseD_5:
  return;
}

Assistant:

void
	emitPendingCus(
		Emitter& emitter,
		const utf8_t* p
	) {
		switch (m_state) {
		case State_1_2:
		case State_1_2_Error:
			emitter.emitCu(p, 0xc0 | m_cp);
			break;

		case State_1_3:
		case State_1_3_Error:
			emitter.emitCu(p, 0xe0 | m_cp);
			break;

		case State_2_3:
			emitter.emitCu(p - 1, 0xe0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_1_4:
		case State_1_4_Error:
			emitter.emitCu(p, 0xf0 | m_cp);
			break;

		case State_2_4:
			emitter.emitCu(p - 1, 0xf0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_3_4:
			emitter.emitCu(p - 2, 0xf0 | (m_cp >> 12));
			emitter.emitCu(p - 1, 0x80 | ((m_cp >> 6) & 0x3f));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;
		}
	}